

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio.cc
# Opt level: O1

void Imageio::declareImageioFormat
               (string *formatname,Creator inputCreator,char **inputExtensions,Creator outputCreator
               ,char **outputExtensions)

{
  iterator iVar1;
  mapped_type *pp_Var2;
  iterator iVar3;
  mapped_type *pp_Var4;
  char *pcVar5;
  char **ppcVar6;
  string ext;
  allocator<char> local_a9;
  string *local_a8;
  mapped_type local_a0;
  key_type local_98;
  mapped_type local_78;
  string local_70;
  string local_50;
  
  local_a8 = formatname;
  local_a0 = outputCreator;
  local_78 = inputCreator;
  if (inputCreator != (Creator)0x0) {
    if ((inputExtensions != (char **)0x0) && (pcVar5 = *inputExtensions, pcVar5 != (char *)0x0)) {
      ppcVar6 = inputExtensions + 1;
      do {
        ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,pcVar5,&local_a9);
        string::tolower(&local_50,(int)&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50.super_string._M_dataplus._M_p != &local_50.super_string.field_2) {
          operator_delete(local_50.super_string._M_dataplus._M_p,
                          local_50.super_string.field_2._M_allocated_capacity + 1);
        }
        iVar1 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                        *)inputFormats_abi_cxx11_,&local_98);
        if (iVar1._M_node == (_Base_ptr)(inputFormats_abi_cxx11_ + 8)) {
          pp_Var2 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                                  *)inputFormats_abi_cxx11_,&local_98);
          *pp_Var2 = local_78;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        pcVar5 = *ppcVar6;
        ppcVar6 = ppcVar6 + 1;
      } while (pcVar5 != (char *)0x0);
    }
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                    *)inputFormats_abi_cxx11_,local_a8);
    if (iVar1._M_node == (_Base_ptr)(inputFormats_abi_cxx11_ + 8)) {
      pp_Var2 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageInput_*(*)()>_>_>
                              *)inputFormats_abi_cxx11_,local_a8);
      *pp_Var2 = local_78;
    }
  }
  if (local_a0 != (mapped_type)0x0) {
    if ((outputExtensions != (char **)0x0) && (pcVar5 = *outputExtensions, pcVar5 != (char *)0x0)) {
      ppcVar6 = outputExtensions + 1;
      do {
        ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,pcVar5,&local_a9);
        string::tolower(&local_70,(int)&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.super_string._M_dataplus._M_p != &local_70.super_string.field_2) {
          operator_delete(local_70.super_string._M_dataplus._M_p,
                          local_70.super_string.field_2._M_allocated_capacity + 1);
        }
        iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
                        *)outputFormats_abi_cxx11_,&local_98);
        if (iVar3._M_node == (_Base_ptr)(outputFormats_abi_cxx11_ + 8)) {
          pp_Var4 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
                                  *)outputFormats_abi_cxx11_,&local_98);
          *pp_Var4 = local_a0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        pcVar5 = *ppcVar6;
        ppcVar6 = ppcVar6 + 1;
      } while (pcVar5 != (char *)0x0);
    }
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
                    *)outputFormats_abi_cxx11_,local_a8);
    if (iVar3._M_node == (_Base_ptr)(outputFormats_abi_cxx11_ + 8)) {
      pp_Var4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
                              *)outputFormats_abi_cxx11_,local_a8);
      *pp_Var4 = local_a0;
    }
  }
  return;
}

Assistant:

void
declareImageioFormat(const std::string& formatname,
                     ImageInput::Creator inputCreator,
                     const char** inputExtensions,
                     ImageOutput::Creator outputCreator,
                     const char** outputExtensions)
{
    if (inputCreator) {
        for (const char** e = inputExtensions; e && *e; ++e) {
            string ext(*e);
            ext.tolower();
            if (inputFormats.find(ext) == inputFormats.end()) {
                inputFormats[ext] = inputCreator;
            }
        }
        if (inputFormats.find(formatname) == inputFormats.end())
            inputFormats[formatname] = inputCreator;
    }
    if (outputCreator) {
        for (const char** e = outputExtensions; e && *e; ++e) {
            string ext(*e);
            ext.tolower();
            if (outputFormats.find(ext) == outputFormats.end()) {
                outputFormats[ext] = outputCreator;
            }
        }
        if (outputFormats.find(formatname) == outputFormats.end())
            outputFormats[formatname] = outputCreator;
    }
}